

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O0

void __thiscall
FrobTadsApplicationCurses::~FrobTadsApplicationCurses(FrobTadsApplicationCurses *this)

{
  unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *in_RDI;
  
  (in_RDI->_M_t).super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
  super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
  super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl = (FrobTadsWindow *)&PTR_init_0042a218
  ;
  curs_set(0);
  if (((ulong)in_RDI[1]._M_t.
              super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
              super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
              super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl & 0x100000000) == 0) {
    std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::operator->
              ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)0x21b7f2);
    FrobTadsWindow::flush((FrobTadsWindow *)0x21b7fa);
  }
  endwin();
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)in_RDI);
  std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::~unique_ptr(in_RDI);
  FrobTadsApplication::~FrobTadsApplication((FrobTadsApplication *)0x21b831);
  return;
}

Assistant:

FrobTadsApplicationCurses::~FrobTadsApplicationCurses()
{
    // Enable the cursor.
    curs_set(0);

    // Flush any pending output so we won't lose any "thanks for
    // playing" messages when "pausing prior to exit" is disabled.
    if (not this->options.exitPause)
        this->fGameWindow->flush();

    // Shut down curses.
    endwin();
}